

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QSqlField>::emplace<QSqlField_const&>
          (QMovableArrayOps<QSqlField> *this,qsizetype i,QSqlField *args)

{
  QSqlField **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  QSqlField *pQVar5;
  QExplicitlySharedDataPointer<QSqlFieldPrivate> QVar6;
  qsizetype qVar7;
  long in_FS_OFFSET;
  bool bVar8;
  Inserter local_80;
  QSqlField tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.size == i) {
      qVar7 = QArrayDataPointer<QSqlField>::freeSpaceAtEnd((QArrayDataPointer<QSqlField> *)this);
      if (qVar7 == 0) goto LAB_00125083;
      QSqlField::QSqlField
                ((this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.ptr +
                 (this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.size,
                 args);
LAB_001251d0:
      pqVar2 = &(this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0012518f;
    }
LAB_00125083:
    if (i == 0) {
      qVar7 = QArrayDataPointer<QSqlField>::freeSpaceAtBegin((QArrayDataPointer<QSqlField> *)this);
      if (qVar7 != 0) {
        QSqlField::QSqlField
                  ((this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.ptr
                   + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_001251d0;
      }
    }
  }
  tmp.d.d.ptr = (totally_ordered_wrapper<QSqlFieldPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  tmp.val.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.val.d._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.val.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.val.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QSqlField::QSqlField(&tmp,args);
  bVar8 = (this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.size != 0;
  QArrayDataPointer<QSqlField>::detachAndGrow
            ((QArrayDataPointer<QSqlField> *)this,(uint)(i == 0 && bVar8),1,(QSqlField **)0x0,
             (QArrayDataPointer<QSqlField> *)0x0);
  QVar6 = tmp.d;
  if (i == 0 && bVar8) {
    pQVar5 = (this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.ptr;
    *(undefined8 *)((long)&pQVar5[-1].val.d.data + 0x10) = tmp.val.d.data._16_8_;
    *(undefined8 *)&pQVar5[-1].val.d.field_0x18 = tmp.val.d._24_8_;
    pQVar5[-1].val.d.data.shared = tmp.val.d.data.shared;
    *(undefined8 *)((long)&pQVar5[-1].val.d.data + 8) = tmp.val.d.data._8_8_;
    tmp.val.d.data.shared = (PrivateShared *)0x0;
    tmp.val.d.data._8_8_ = 0;
    tmp.val.d.data._16_8_ = 0;
    tmp.val.d._24_8_ = 2;
    tmp.d.d.ptr = (totally_ordered_wrapper<QSqlFieldPrivate_*>)(QSqlFieldPrivate *)0x0;
    pQVar5[-1].d.d.ptr = (QSqlFieldPrivate *)QVar6.d.ptr;
    ppQVar1 = &(this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QSqlField> *)this,i,1);
    QVar6 = tmp.d;
    *(undefined8 *)((long)&((local_80.displaceFrom)->val).d.data + 0x10) = tmp.val.d.data._16_8_;
    *(undefined8 *)&((local_80.displaceFrom)->val).d.field_0x18 = tmp.val.d._24_8_;
    ((local_80.displaceFrom)->val).d.data.shared = tmp.val.d.data.shared;
    *(undefined8 *)((long)&((local_80.displaceFrom)->val).d.data + 8) = tmp.val.d.data._8_8_;
    tmp.val.d.data.shared = (PrivateShared *)0x0;
    tmp.val.d.data._8_8_ = 0;
    tmp.val.d.data._16_8_ = 0;
    tmp.val.d._24_8_ = 2;
    tmp.d.d.ptr = (totally_ordered_wrapper<QSqlFieldPrivate_*>)(QSqlFieldPrivate *)0x0;
    ((local_80.displaceFrom)->d).d.ptr = (QSqlFieldPrivate *)QVar6.d.ptr;
    local_80.displaceFrom = local_80.displaceFrom + 1;
    Inserter::~Inserter(&local_80);
  }
  QSqlField::~QSqlField(&tmp);
LAB_0012518f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }